

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_network.cpp
# Opt level: O2

size_t sensors_analytics::helpers::HeaderCallback
                 (void *data,size_t size,size_t nmemb,void *user_data)

{
  long lVar1;
  mapped_type *pmVar2;
  string header;
  string value;
  string key;
  
  header._M_dataplus._M_p = (pointer)&header.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&header,data,(void *)((long)data + size * nmemb));
  lVar1 = std::__cxx11::string::find((char)&header,0x3a);
  if (lVar1 == -1) {
    Trim(&header);
    if (header._M_string_length != 0) {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)user_data + 0x28),&header);
      std::__cxx11::string::assign((char *)pmVar2);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&key,(ulong)&header);
    Trim(&key);
    std::__cxx11::string::substr((ulong)&value,(ulong)&header);
    Trim(&value);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)((long)user_data + 0x28),&key);
    std::__cxx11::string::_M_assign((string *)pmVar2);
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  }
  std::__cxx11::string::~string((string *)&header);
  return size * nmemb;
}

Assistant:

size_t helpers::HeaderCallback(void *data, size_t size, size_t nmemb,
                               void *user_data) {
  Response *r;
  r = reinterpret_cast<Response *>(user_data);
  string header(reinterpret_cast<char *>(data), size * nmemb);
  size_t separator = header.find_first_of(':');
  if (string::npos == separator) {
    // roll with non seperated headers...
    Trim(header);
    if (0 == header.length()) {
      return (size * nmemb);  // blank line;
    }
    r->headers_[header] = "present";
  } else {
    string key = header.substr(0, separator);
    Trim(key);
    string value = header.substr(separator + 1);
    Trim(value);
    r->headers_[key] = value;
  }

  return (size * nmemb);
}